

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O1

pair<helics::route_id,_helics::ActionMessage> * __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
::pop(pair<helics::route_id,_helics::ActionMessage> *__return_storage_ptr__,
     BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
     *this)

{
  bool bVar1;
  ActionMessage *pAVar2;
  SmallBuffer *pSVar3;
  bool bVar4;
  _Elt_pointer ppVar5;
  pointer ppVar6;
  ActionMessage *this_00;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> local_1d8;
  unique_lock *local_1c8;
  undefined1 local_1c0 [192];
  bool local_100;
  undefined1 local_f8 [192];
  bool local_38;
  
  (__return_storage_ptr__->first).rid = -0x4d3263e0;
  this_00 = &__return_storage_ptr__->second;
  (__return_storage_ptr__->second).messageAction = cmd_ignore;
  (__return_storage_ptr__->second).messageID = 0;
  (__return_storage_ptr__->second).source_id = 0;
  (__return_storage_ptr__->second).source_handle = -1700000000;
  (__return_storage_ptr__->second).dest_id = 0;
  (__return_storage_ptr__->second).dest_handle = -1700000000;
  (__return_storage_ptr__->second).counter = 0;
  (__return_storage_ptr__->second).flags = 0;
  (__return_storage_ptr__->second).sequenceID = 0;
  (__return_storage_ptr__->second).actionTime.internalTimeCode = 0;
  (__return_storage_ptr__->second).Te.internalTimeCode = 0;
  (__return_storage_ptr__->second).Tdemin.internalTimeCode = 0;
  (__return_storage_ptr__->second).Tso.internalTimeCode = 0;
  pAVar2 = &__return_storage_ptr__->second;
  (pAVar2->payload).buffer._M_elems[0] = 0;
  (pAVar2->payload).buffer._M_elems[1] = 0;
  (pAVar2->payload).buffer._M_elems[2] = 0;
  (pAVar2->payload).buffer._M_elems[3] = 0;
  (pAVar2->payload).buffer._M_elems[4] = 0;
  (pAVar2->payload).buffer._M_elems[5] = 0;
  (pAVar2->payload).buffer._M_elems[6] = 0;
  (pAVar2->payload).buffer._M_elems[7] = 0;
  pSVar3 = &(__return_storage_ptr__->second).payload;
  (pSVar3->buffer)._M_elems[8] = 0;
  (pSVar3->buffer)._M_elems[9] = 0;
  (pSVar3->buffer)._M_elems[10] = 0;
  (pSVar3->buffer)._M_elems[0xb] = 0;
  (pSVar3->buffer)._M_elems[0xc] = 0;
  (pSVar3->buffer)._M_elems[0xd] = 0;
  (pSVar3->buffer)._M_elems[0xe] = 0;
  (pSVar3->buffer)._M_elems[0xf] = 0;
  pSVar3 = &(__return_storage_ptr__->second).payload;
  (pSVar3->buffer)._M_elems[0x10] = 0;
  (pSVar3->buffer)._M_elems[0x11] = 0;
  (pSVar3->buffer)._M_elems[0x12] = 0;
  (pSVar3->buffer)._M_elems[0x13] = 0;
  (pSVar3->buffer)._M_elems[0x14] = 0;
  (pSVar3->buffer)._M_elems[0x15] = 0;
  (pSVar3->buffer)._M_elems[0x16] = 0;
  (pSVar3->buffer)._M_elems[0x17] = 0;
  pSVar3 = &(__return_storage_ptr__->second).payload;
  (pSVar3->buffer)._M_elems[0x18] = 0;
  (pSVar3->buffer)._M_elems[0x19] = 0;
  (pSVar3->buffer)._M_elems[0x1a] = 0;
  (pSVar3->buffer)._M_elems[0x1b] = 0;
  (pSVar3->buffer)._M_elems[0x1c] = 0;
  (pSVar3->buffer)._M_elems[0x1d] = 0;
  (pSVar3->buffer)._M_elems[0x1e] = 0;
  (pSVar3->buffer)._M_elems[0x1f] = 0;
  pSVar3 = &(__return_storage_ptr__->second).payload;
  (pSVar3->buffer)._M_elems[0x20] = 0;
  (pSVar3->buffer)._M_elems[0x21] = 0;
  (pSVar3->buffer)._M_elems[0x22] = 0;
  (pSVar3->buffer)._M_elems[0x23] = 0;
  (pSVar3->buffer)._M_elems[0x24] = 0;
  (pSVar3->buffer)._M_elems[0x25] = 0;
  (pSVar3->buffer)._M_elems[0x26] = 0;
  (pSVar3->buffer)._M_elems[0x27] = 0;
  pSVar3 = &(__return_storage_ptr__->second).payload;
  (pSVar3->buffer)._M_elems[0x28] = 0;
  (pSVar3->buffer)._M_elems[0x29] = 0;
  (pSVar3->buffer)._M_elems[0x2a] = 0;
  (pSVar3->buffer)._M_elems[0x2b] = 0;
  (pSVar3->buffer)._M_elems[0x2c] = 0;
  (pSVar3->buffer)._M_elems[0x2d] = 0;
  (pSVar3->buffer)._M_elems[0x2e] = 0;
  (pSVar3->buffer)._M_elems[0x2f] = 0;
  pSVar3 = &(__return_storage_ptr__->second).payload;
  (pSVar3->buffer)._M_elems[0x30] = 0;
  (pSVar3->buffer)._M_elems[0x31] = 0;
  (pSVar3->buffer)._M_elems[0x32] = 0;
  (pSVar3->buffer)._M_elems[0x33] = 0;
  (pSVar3->buffer)._M_elems[0x34] = 0;
  (pSVar3->buffer)._M_elems[0x35] = 0;
  (pSVar3->buffer)._M_elems[0x36] = 0;
  (pSVar3->buffer)._M_elems[0x37] = 0;
  pSVar3 = &(__return_storage_ptr__->second).payload;
  (pSVar3->buffer)._M_elems[0x38] = 0;
  (pSVar3->buffer)._M_elems[0x39] = 0;
  (pSVar3->buffer)._M_elems[0x3a] = 0;
  (pSVar3->buffer)._M_elems[0x3b] = 0;
  (pSVar3->buffer)._M_elems[0x3c] = 0;
  (pSVar3->buffer)._M_elems[0x3d] = 0;
  (pSVar3->buffer)._M_elems[0x3e] = 0;
  (pSVar3->buffer)._M_elems[0x3f] = 0;
  (__return_storage_ptr__->second).payload.bufferSize = 0;
  (__return_storage_ptr__->second).payload.bufferCapacity = 0x40;
  (__return_storage_ptr__->second).payload.heap = (byte *)&(__return_storage_ptr__->second).payload;
  (__return_storage_ptr__->second).payload.nonOwning = false;
  (__return_storage_ptr__->second).payload.locked = false;
  (__return_storage_ptr__->second).payload.usingAllocatedBuffer = false;
  (__return_storage_ptr__->second).payload.errorCondition = '\0';
  (__return_storage_ptr__->second).payload.userKey = 0;
  (__return_storage_ptr__->second).stringData.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->second).stringData.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).stringData.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)local_1c0,this);
  local_1c8 = (unique_lock *)&this->condition;
  bVar4 = false;
  do {
    if (local_100 != false) {
      (__return_storage_ptr__->first).rid = local_1c0._0_4_;
      helics::ActionMessage::operator=(this_00,(ActionMessage *)(local_1c0 + 8));
      if (local_100 != true) {
        return __return_storage_ptr__;
      }
      local_100 = false;
      this_00 = (ActionMessage *)(local_1c0 + 8);
      goto LAB_002a6ab4;
    }
    local_1d8._M_owns = false;
    local_1d8._M_device = &this->m_pullLock;
    std::unique_lock<std::mutex>::lock(&local_1d8);
    local_1d8._M_owns = true;
    ppVar5 = (this->priorityQueue).c.
             super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->priorityQueue).c.
        super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar5) {
      ppVar6 = (this->pullElements).
               super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ._M_impl.super__Vector_impl_data._M_start != ppVar6) {
LAB_002a6992:
        (__return_storage_ptr__->first).rid = ppVar6[-1].first.rid;
        helics::ActionMessage::operator=(this_00,&ppVar6[-1].second);
        ppVar6 = (this->pullElements).
                 super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->pullElements).
        super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar6 + -1;
        helics::ActionMessage::~ActionMessage(&ppVar6[-1].second);
        goto LAB_002a69c8;
      }
      std::condition_variable::wait(local_1c8);
      ppVar5 = (this->priorityQueue).c.
               super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->priorityQueue).c.
          super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar5) goto LAB_002a696a;
      ppVar6 = (this->pullElements).
               super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ._M_impl.super__Vector_impl_data._M_start != ppVar6) goto LAB_002a6992;
      std::unique_lock<std::mutex>::unlock(&local_1d8);
      try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)local_f8,this);
      std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::
      _M_move_assign((_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     local_1c0,
                     (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     local_f8);
      if (local_38 == true) {
        local_38 = false;
        helics::ActionMessage::~ActionMessage((ActionMessage *)(local_f8 + 8));
      }
      bVar1 = true;
    }
    else {
LAB_002a696a:
      (__return_storage_ptr__->first).rid = (ppVar5->first).rid;
      helics::ActionMessage::operator=(this_00,&ppVar5->second);
      std::
      deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ::pop_front(&(this->priorityQueue).c);
LAB_002a69c8:
      bVar4 = true;
      bVar1 = false;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_1d8);
  } while (bVar1);
  if (local_100 == true) {
    local_100 = false;
    helics::ActionMessage::~ActionMessage((ActionMessage *)(local_1c0 + 8));
  }
  if (!bVar4) {
LAB_002a6ab4:
    helics::ActionMessage::~ActionMessage(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

T pop()
        {
            T actval;
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            actval = std::move(*val);
            return actval;
        }